

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall CLIntercept::logKernelInfo(CLIntercept *this,cl_kernel *kernels,cl_uint numKernels)

{
  cl_device_id *pp_Var1;
  int iVar2;
  cl_int cVar3;
  cl_int cVar4;
  cl_int cVar5;
  long *plVar6;
  undefined8 uVar7;
  long *plVar8;
  ulong uVar9;
  cl_kernel p_Var10;
  ulong uVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar12;
  float __x;
  float fVar13;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar14;
  cl_uint numDevices;
  cl_uint regCount;
  cl_uint args;
  cl_device_id *deviceList;
  size_t rwgs [3];
  cl_ulong sms;
  cl_ulong lms;
  cl_ulong pms;
  size_t wgs;
  size_t pwgsm;
  char *deviceName;
  cl_program program;
  cl_uint local_11c [3];
  pthread_mutex_t *local_110;
  cl_device_id *local_108;
  cl_int local_100;
  cl_int local_fc;
  cl_int local_f8;
  cl_int local_f4;
  cl_int local_f0;
  cl_int local_ec;
  long *local_e8;
  long lStack_e0;
  long local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  cl_kernel *local_c0;
  cl_kernel local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  ulong local_68;
  ulong local_60;
  cl_program local_58;
  string local_50;
  
  if (numKernels != 0) {
    local_110 = (pthread_mutex_t *)&this->m_Mutex;
    local_c0 = kernels;
    iVar2 = pthread_mutex_lock(local_110);
    if (iVar2 != 0) {
      uVar7 = std::__throw_system_error(iVar2);
      pthread_mutex_unlock(local_110);
      _Unwind_Resume(uVar7);
    }
    local_58 = (cl_program)0x0;
    cVar3 = (*(this->m_Dispatch).clGetKernelInfo)(*local_c0,0x1194,8,&local_58,(size_t *)0x0);
    local_11c[0] = 0;
    local_108 = (cl_device_id *)0x0;
    if (cVar3 == 0) {
      allocateAndGetProgramDeviceList(this,local_58,local_11c,&local_108);
    }
    if (local_11c[0] != 0) {
      uVar11 = (ulong)numKernels;
      do {
        uVar9 = uVar11 - 1;
        if (uVar11 == 0) break;
        local_b8 = local_c0[uVar9];
        getShortKernelNameWithHash_abi_cxx11_(&local_50,this,local_b8);
        std::operator+(&local_88,"Kernel Info for: ",&local_50);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
        plVar8 = plVar6 + 2;
        if ((long *)*plVar6 == plVar8) {
          uVar12 = (undefined4)*plVar8;
          uVar14 = *(undefined4 *)((long)plVar6 + 0x14);
          local_d8 = *plVar8;
          uStack_d0 = (undefined4)plVar6[3];
          uStack_cc = *(undefined4 *)((long)plVar6 + 0x1c);
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *plVar8;
          uVar12 = extraout_XMM0_Da;
          uVar14 = extraout_XMM0_Db;
          local_e8 = (long *)*plVar6;
        }
        lStack_e0 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        log(this,(double)CONCAT44(uVar14,uVar12));
        local_68 = uVar9;
        if (local_e8 != &local_d8) {
          operator_delete(local_e8);
        }
        p_Var10 = local_b8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        if (local_11c[0] != 0) {
          uVar11 = 0;
          do {
            pp_Var1 = local_108;
            local_88._M_dataplus._M_p = (pointer)0x0;
            cVar3 = allocateAndGetDeviceInfoString(this,local_108[uVar11],0x102b,(char **)&local_88)
            ;
            local_11c[2] = 0;
            cVar4 = (*(this->m_Dispatch).clGetKernelInfo)
                              (p_Var10,0x1191,4,local_11c + 2,(size_t *)0x0);
            local_90 = 0;
            local_ec = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                                 (p_Var10,pp_Var1[uVar11],0x11b3,8,&local_90,(size_t *)0x0);
            local_98 = 0;
            local_f0 = cVar4;
            local_f4 = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                                 (p_Var10,pp_Var1[uVar11],0x11b0,8,&local_98,(size_t *)0x0);
            local_e8 = (long *)0x0;
            lStack_e0 = 0;
            local_d8 = 0;
            cVar4 = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                              (p_Var10,pp_Var1[uVar11],0x11b1,0x18,&local_e8,(size_t *)0x0);
            local_a0 = 0;
            local_f8 = cVar3;
            local_fc = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                                 (p_Var10,pp_Var1[uVar11],0x11b4,8,&local_a0,(size_t *)0x0);
            local_a8 = 0;
            cVar3 = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                              (p_Var10,pp_Var1[uVar11],0x11b2,8,&local_a8,(size_t *)0x0);
            local_b0 = 0;
            local_100 = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                                  (p_Var10,pp_Var1[uVar11],0x4109,8,&local_b0,(size_t *)0x0);
            local_11c[1] = 0;
            local_60 = uVar11;
            cVar5 = (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                              (p_Var10,pp_Var1[uVar11],0x425b,4,local_11c + 1,(size_t *)0x0);
            if (((cVar4 == 0 && local_fc == 0) && cVar3 == 0) &&
                ((local_ec == 0 && local_f4 == 0) && (local_f0 == 0 && local_f8 == 0))) {
              fVar13 = logf(this,__x);
              if ((this->m_Config).KernelInfoLogging == true) {
                fVar13 = logf(this,fVar13);
              }
              if (((this->m_Config).KernelInfoLogging != false) ||
                 ((this->m_Config).PreferredWorkGroupSizeMultipleLogging == true)) {
                fVar13 = logf(this,fVar13);
              }
              if ((this->m_Config).KernelInfoLogging == true) {
                fVar13 = logf(this,fVar13);
                if ((local_e8 != (long *)0x0 || lStack_e0 != 0) || local_d8 != 0) {
                  fVar13 = logf(this,fVar13);
                }
                fVar13 = logf(this,fVar13);
                fVar13 = logf(this,fVar13);
                if (local_100 == 0) {
                  fVar13 = logf(this,fVar13);
                }
                if (cVar5 == 0) {
                  logf(this,fVar13);
                }
              }
            }
            else if (local_88._M_dataplus._M_p == (pointer)0x0) {
              logf(this,__x);
            }
            else {
              logf(this,__x);
            }
            if (local_88._M_dataplus._M_p != (pointer)0x0) {
              operator_delete__(local_88._M_dataplus._M_p);
            }
            uVar11 = local_60 + 1;
            p_Var10 = local_b8;
          } while (uVar11 < local_11c[0]);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        uVar11 = local_68;
      } while (local_11c[0] != 0);
    }
    if (local_108 != (cl_device_id *)0x0) {
      operator_delete__(local_108);
    }
    pthread_mutex_unlock(local_110);
  }
  return;
}

Assistant:

void CLIntercept::logKernelInfo(
    const cl_kernel* kernels,
    cl_uint numKernels )
{
    if( numKernels > 0 )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        cl_int  errorCode = CL_SUCCESS;

        // We can share the program and device list for all kernels.

        cl_kernel   queryKernel = kernels[0];

        // First, get the program for this kernel.
        cl_program  program = NULL;
        if( errorCode == CL_SUCCESS )
        {
            errorCode = dispatch().clGetKernelInfo(
                queryKernel,
                CL_KERNEL_PROGRAM,
                sizeof(program),
                &program,
                NULL );
        }

        // Next, get the list of devices for the program.
        cl_uint         numDevices = 0;
        cl_device_id*   deviceList = NULL;
        if( errorCode == CL_SUCCESS )
        {
            errorCode = allocateAndGetProgramDeviceList(
                program,
                numDevices,
                deviceList );
        }

        // Log the preferred work group size multiple for each kernel,
        // for each device.
        while( numDevices && numKernels-- )
        {
            cl_kernel   kernel = kernels[ numKernels ];

            const std::string& kernelName = getShortKernelNameWithHash(kernel);
            log( "Kernel Info for: " + kernelName + "\n" );

            for( cl_uint i = 0; i < numDevices; i++ )
            {
                char*   deviceName = NULL;
                errorCode = allocateAndGetDeviceInfoString(
                    deviceList[i],
                    CL_DEVICE_NAME,
                    deviceName );

                cl_uint args = 0;
                errorCode |= dispatch().clGetKernelInfo(
                    kernel,
                    CL_KERNEL_NUM_ARGS,
                    sizeof(args),
                    &args,
                    NULL );

                size_t  pwgsm = 0;
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_PREFERRED_WORK_GROUP_SIZE_MULTIPLE,
                    sizeof(pwgsm),
                    &pwgsm,
                    NULL );
                size_t  wgs = 0;
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_WORK_GROUP_SIZE,
                    sizeof(wgs),
                    &wgs,
                    NULL );
                size_t  rwgs[3] = {0, 0, 0};
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_COMPILE_WORK_GROUP_SIZE,
                    sizeof(rwgs),
                    rwgs,
                    NULL );
                cl_ulong pms = 0;
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_PRIVATE_MEM_SIZE,
                    sizeof(pms),
                    &pms,
                    NULL );
                cl_ulong lms = 0;
                errorCode |= dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_LOCAL_MEM_SIZE,
                    sizeof(lms),
                    &lms,
                    NULL );
                cl_ulong sms = 0;
                cl_int errorCode_sms = dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_SPILL_MEM_SIZE_INTEL,
                    sizeof(sms),
                    &sms,
                    NULL );
                cl_uint regCount = 0;
                cl_int errorCode_regCount = dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    deviceList[i],
                    CL_KERNEL_REGISTER_COUNT_INTEL,
                    sizeof(regCount),
                    &regCount,
                    NULL );
                if( errorCode == CL_SUCCESS )
                {
                    logf( "    For device: %s\n",
                        deviceName );
                    if( config().KernelInfoLogging )
                    {
                        logf( "        Num Args: %u\n", args);
                    }
                    if( config().KernelInfoLogging ||
                        config().PreferredWorkGroupSizeMultipleLogging )
                    {
                        logf( "        Preferred Work Group Size Multiple: %zu\n", pwgsm);
                    }
                    if( config().KernelInfoLogging )
                    {
                        logf( "        Max Work Group Size: %zu\n", wgs);
                        if( rwgs[0] != 0 || rwgs[1] != 0 || rwgs[2] != 0 )
                        {
                            logf( "        Required Work Group Size: < %zu, %zu, %zu >\n",
                                rwgs[0], rwgs[1], rwgs[2]);
                        }
                        logf( "        Private Mem Size: %u\n", (cl_uint)pms);
                        logf( "        Local Mem Size: %u\n", (cl_uint)lms);
                        if( errorCode_sms == CL_SUCCESS )
                        {
                            logf( "        Spill Mem Size: %u\n", (cl_uint)sms);
                        }
                        if( errorCode_regCount == CL_SUCCESS )
                        {
                            logf( "        Register Count: %u\n", regCount);
                        }
                    }
                }
                else if( deviceName )
                {
                    logf( "Error querying kernel info for device %s!\n", deviceName );
                }
                else
                {
                    logf( "Error querying kernel info!\n" );
                }

                delete [] deviceName;
            }
        }

        delete [] deviceList;
    }
}